

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.cpp
# Opt level: O0

tuple<ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* eval_args_abi_cxx11_
            (tuple<ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,int argc,char **argv)

{
  char *pcVar1;
  runtime_error *this;
  double dVar2;
  double dVar3;
  Section local_c8;
  ImageSize local_ac;
  allocator<char> local_a1;
  undefined1 local_a0 [8];
  string filename;
  undefined1 local_78 [8];
  string colors;
  double height;
  double center_y;
  double center_x;
  int local_38;
  int repetitions;
  int max_iterations;
  int image_height;
  int image_width;
  char **local_20;
  char **argv_local;
  tuple<ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ptStack_10;
  int argc_local;
  
  local_20 = argv;
  argv_local._4_4_ = argc;
  ptStack_10 = __return_storage_ptr__;
  if (argc != 10) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"invalid number of arguments");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  max_iterations = eval_arg<int>(argv[1],1,100000);
  repetitions = eval_arg<int>(local_20[2],1,100000);
  local_38 = eval_arg<int>(local_20[3],1,1000000000);
  center_x._4_4_ = eval_arg<int>(local_20[4],1,1000000);
  dVar2 = eval_arg<double>(local_20[5],-100.0,100.0);
  dVar3 = eval_arg<double>(local_20[6],-100.0,100.0);
  colors.field_2._8_8_ = eval_arg<double>(local_20[7],-100.0,100.0);
  pcVar1 = local_20[8];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,pcVar1,(allocator<char> *)(filename.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(filename.field_2._M_local_buf + 0xf));
  pcVar1 = local_20[9];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,pcVar1,&local_a1);
  std::allocator<char>::~allocator(&local_a1);
  local_ac.width = max_iterations;
  local_ac.height = repetitions;
  local_c8.height = (double)colors.field_2._8_8_;
  local_c8.center_x = dVar2;
  local_c8.center_y = dVar3;
  std::make_tuple<ImageSize,Section,int&,int&,std::__cxx11::string&,std::__cxx11::string&>
            (__return_storage_ptr__,&local_ac,&local_c8,&local_38,(int *)((long)&center_x + 4),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_78);
  return __return_storage_ptr__;
}

Assistant:

auto eval_args(const int argc, char const* argv[])
{
    if (argc != 10)
        throw std::runtime_error("invalid number of arguments");

    auto image_width    = eval_arg(argv[1], 1, 100000);
    auto image_height   = eval_arg(argv[2], 1, 100000);
    auto max_iterations = eval_arg(argv[3], 1, 1000000000);
    auto repetitions    = eval_arg(argv[4], 1, 1000000);
    auto center_x       = eval_arg(argv[5], -100.0, 100.0);
    auto center_y       = eval_arg(argv[6], -100.0, 100.0);
    auto height         = eval_arg(argv[7], -100.0, 100.0);
    auto colors         = std::string{argv[8]};
    auto filename       = std::string{argv[9]};

    return std::make_tuple(ImageSize{image_width, image_height}, Section{center_x, center_y, height}, max_iterations, repetitions, colors, filename);
}